

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary.cpp
# Opt level: O3

int __thiscall CBoundary::AddPenalty(CBoundary *this,int iPenalty)

{
  int iVar1;
  
  iVar1 = (int)((double)(this->super_CPoint).super_CObject.m_iProp +
               (double)(iPenalty * this->m_iCongestion * (int)this->m_iCongestion) / 10000.0);
  (this->super_CPoint).super_CObject.m_iProp = iVar1;
  return iVar1;
}

Assistant:

int CBoundary::AddPenalty(int iPenalty)
{
	//if(iPenalty<0)
	//{
	//	m_iProp	=	0;
	//	if(GetOverFlow())
	//	{
	//		double	dPenalty	=	0;
	//		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
	//		{
	//			dPenalty	+=	(*itr)->GetParent()->m_fPenalty;
	//		}
	//		m_iProp	=	dPenalty;
	//	}
	//}
	//else
	//{
		m_iProp	+=	iPenalty*SQRE(m_iCongestion)/10000.0;
	//}

	return	m_iProp;
}